

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

AllocResult<kj::_::BTreeImpl::Parent> __thiscall
kj::_::BTreeImpl::alloc<kj::_::BTreeImpl::Parent>(BTreeImpl *this)

{
  uint uVar1;
  Parent *pPVar2;
  AllocResult<kj::_::BTreeImpl::Parent> AVar3;
  NodeUnion *ptr;
  uint i;
  BTreeImpl *this_local;
  
  uVar1 = this->freelistHead;
  this->freelistHead = uVar1 + 1 + this->tree[uVar1].field_0.leaf.next;
  this->freelistSize = this->freelistSize - 1;
  pPVar2 = NodeUnion::operator_cast_to_Parent_(this->tree + uVar1);
  AVar3._4_4_ = 0;
  AVar3.index = uVar1;
  AVar3.node = pPVar2;
  return AVar3;
}

Assistant:

inline BTreeImpl::AllocResult<T> BTreeImpl::alloc() {
  // Allocate a new item from the freelist. Guaranteed to be zero'd except for the first member.
  uint i = freelistHead;
  NodeUnion* ptr = &tree[i];
  freelistHead = i + 1 + ptr->freelist.nextOffset;
  --freelistSize;
  return { i, *ptr };
}